

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::TrackUnallocated(Recycler *this,char *address,char *endAddress,size_t sizeCat)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  TrackerData *pTVar4;
  undefined8 *in_FS_OFFSET;
  
  if ((Js::Configuration::Global[0x2c159] == '\0') &&
     (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0)) {
    CCLock::Enter(&this->trackerCriticalSection->super_CCLock);
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    do {
      if (endAddress < address + sizeCat) {
        CCLock::Leave(&this->trackerCriticalSection->super_CCLock);
        return;
      }
      pTVar4 = GetTrackerData(this,address);
      if (pTVar4 != (TrackerData *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x209e,"(GetTrackerData(address) == nullptr)",
                           "GetTrackerData(address) == nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
      }
      SetTrackerData(this,address,&TrackerData::EmptyData);
      address = address + sizeCat;
    } while( true );
  }
  return;
}

Assistant:

void
Recycler::TrackUnallocated(__in char* address, __in  char *endAddress, size_t sizeCat)
{
    if (!CONFIG_FLAG(KeepRecyclerTrackData))
    {
        if (this->trackerDictionary != nullptr)
        {
            trackerCriticalSection->Enter();
            while (address + sizeCat <= endAddress)
            {
                Assert(GetTrackerData(address) == nullptr);
                SetTrackerData(address, &TrackerData::EmptyData);
                address += sizeCat;
            }
            trackerCriticalSection->Leave();
        }
    }
}